

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmTable.c
# Opt level: O3

void Nm_ManProfile(Nm_Man_t *p)

{
  Nm_Entry_t *pNVar1;
  ulong uVar2;
  long lVar3;
  
  printf("I2N table: ");
  if (0 < p->nBins) {
    lVar3 = 0;
    do {
      pNVar1 = p->pBinsI2N[lVar3];
      uVar2 = 0;
      if (pNVar1 != (Nm_Entry_t *)0x0) {
        uVar2 = 0;
        do {
          uVar2 = (ulong)((int)uVar2 + 1);
          pNVar1 = pNVar1->pNextI2N;
        } while (pNVar1 != (Nm_Entry_t *)0x0);
      }
      printf("%d ",uVar2);
      lVar3 = lVar3 + 1;
    } while (lVar3 < p->nBins);
  }
  putchar(10);
  printf("N2I table: ");
  if (0 < p->nBins) {
    lVar3 = 0;
    do {
      pNVar1 = p->pBinsN2I[lVar3];
      uVar2 = 0;
      if (pNVar1 != (Nm_Entry_t *)0x0) {
        uVar2 = 0;
        do {
          uVar2 = (ulong)((int)uVar2 + 1);
          pNVar1 = pNVar1->pNextN2I;
        } while (pNVar1 != (Nm_Entry_t *)0x0);
      }
      printf("%d ",uVar2);
      lVar3 = lVar3 + 1;
    } while (lVar3 < p->nBins);
  }
  putchar(10);
  return;
}

Assistant:

void Nm_ManProfile( Nm_Man_t * p )
{
    Nm_Entry_t * pEntry;
    int Counter, e;
    printf( "I2N table: " );
    for ( e = 0; e < p->nBins; e++ )
    {
        Counter = 0;
        for ( pEntry = p->pBinsI2N[e]; pEntry; pEntry = pEntry->pNextI2N )
            Counter++;
        printf( "%d ", Counter );
    }
    printf( "\n" );
    printf( "N2I table: " );
    for ( e = 0; e < p->nBins; e++ )
    {
        Counter = 0;
        for ( pEntry = p->pBinsN2I[e]; pEntry; pEntry = pEntry->pNextN2I )
            Counter++;
        printf( "%d ", Counter );
    }
    printf( "\n" );
}